

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::costSecondPartialDerivativeWRTControl
          (L2NormCost *this,double param_1,VectorDynSize *param_2,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  L2NormCostImplementation *pLVar1;
  bool bVar2;
  string local_48;
  
  pLVar1 = this->m_pimpl;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"control","");
  bVar2 = CostAttributes::getHessian(&pLVar1->controlCost,control,partialDerivative,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool L2NormCost::costSecondPartialDerivativeWRTControl(double /*time*/, const VectorDynSize &/*state*/, const VectorDynSize &control, MatrixDynSize &partialDerivative)
        {
            return m_pimpl->controlCost.getHessian(control, partialDerivative, "control");
        }